

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_implementation.hpp
# Opt level: O1

void __thiscall
so_5::disp::thread_pool::common_implementation::
dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>
::supply(dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>
         *this,stats_consumer_t *consumer)

{
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_lock);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  (**consumer->_vptr_stats_consumer_t)
            (consumer,(long)(this->m_threads).
                            super__Vector_base<std::unique_ptr<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_std::default_delete<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>_>_>,_std::allocator<std::unique_ptr<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_std::default_delete<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_threads).
                            super__Vector_base<std::unique_ptr<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_std::default_delete<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>_>_>,_std::allocator<std::unique_ptr<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_std::default_delete<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3);
  for (p_Var2 = (this->m_cooperations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_cooperations)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    p_Var2[2]._M_left[1]._M_right = p_Var2[2]._M_parent;
    *(undefined8 *)(p_Var2[2]._M_left + 2) = *(undefined8 *)(*(long *)(p_Var2 + 2) + 0x68);
    (*consumer->_vptr_stats_consumer_t[1])(consumer,&p_Var2[2]._M_left);
  }
  for (p_Var2 = (this->m_agents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_agents)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    if (p_Var2[1]._M_left != (_Base_ptr)0x0) {
      p_Var2[1]._M_left[1]._M_right = (_Base_ptr)0x1;
      *(_Base_ptr *)(p_Var2[1]._M_left + 2) = p_Var2[1]._M_parent[3]._M_parent;
      (*consumer->_vptr_stats_consumer_t[1])(consumer,&p_Var2[1]._M_left);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
  return;
}

Assistant:

virtual void
		supply( tp_stats::stats_consumer_t & consumer ) override
			{
				// Statics must be collected on locked object.
				std::lock_guard< std::mutex > lock( m_lock );

				consumer.set_thread_count( m_threads.size() );

				for( auto & t : m_threads )
					{
						using stats_t = so_5::stats::work_thread_activity_stats_t;

						WORK_THREAD & wt = *t;
						wt.take_activity_stats(
							[&wt, &consumer]( const stats_t & st ) {
								consumer.add_work_thread_activity( wt.thread_id(), st );
							} );
					}

				for( auto & q : m_cooperations )
					{
						auto & s = q.second;
						s.update_queue_stats();
						consumer.add_queue( s.m_queue_desc );
					}

				for( auto & a : m_agents )
					{
						auto & s = a.second;
						if( !s.cooperation_fifo() )
							{
								s.update_queue_stats();
								consumer.add_queue( s.m_queue_desc );
							}
					}
			}